

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentum
          (KinDynComputations *this,Span<double,__1L> spatial_momentum)

{
  SpatialForceVector local_a0 [56];
  Matrix<double,_6,_1,_0,_6,_1> local_68;
  pointer local_30;
  undefined8 local_28;
  
  if (spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalTotalMomentum((SpatialMomentum *)local_a0,this);
    toEigen(&local_68,local_a0);
    local_28 = 6;
    local_30 = spatial_momentum.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_30,
               &local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector(local_a0);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentum",
               "Wrong size in input spatial_momentum");
  }
  return spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentum(iDynTree::Span<double> spatial_momentum)
{
    constexpr int expected_spatial_momentum_size = 6;
    bool ok = spatial_momentum.size() == expected_spatial_momentum_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalTotalMomentum","Wrong size in input spatial_momentum");
        return false;
    }

    toEigen(spatial_momentum) = toEigen(getCentroidalTotalMomentum());

    return true;
}